

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

void pythonAttributeDecl(void *user_data,xmlChar *elem,xmlChar *name,int type,int def,
                        xmlChar *defaultValue,xmlEnumerationPtr tree)

{
  int iVar1;
  _xmlEnumeration *p_Var2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  
  iVar1 = PyObject_HasAttrString(user_data,"attributeDecl");
  if (iVar1 != 0) {
    if (tree == (xmlEnumerationPtr)0x0) {
      plVar3 = (long *)PyList_New(0);
    }
    else {
      lVar5 = 0;
      p_Var2 = tree;
      do {
        p_Var2 = p_Var2->next;
        lVar5 = lVar5 + 1;
      } while (p_Var2 != (_xmlEnumeration *)0x0);
      plVar3 = (long *)PyList_New(lVar5);
      if (tree != (xmlEnumerationPtr)0x0) {
        lVar5 = 0;
        do {
          plVar4 = (long *)PyUnicode_FromString(tree->name);
          PyList_SetItem(plVar3,lVar5,plVar4);
          *plVar4 = *plVar4 + -1;
          if (*plVar4 == 0) {
            _Py_Dealloc(plVar4);
          }
          lVar5 = lVar5 + 1;
          tree = tree->next;
        } while (tree != (_xmlEnumeration *)0x0);
      }
    }
    plVar4 = (long *)_PyObject_CallMethod_SizeT
                               (user_data,"attributeDecl","ssiisO",elem,name,type,def,defaultValue,
                                plVar3);
    lVar5 = PyErr_Occurred();
    if (lVar5 != 0) {
      PyErr_Print();
    }
    if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
      _Py_Dealloc(plVar3);
    }
    if ((plVar4 != (long *)0x0) && (*plVar4 = *plVar4 + -1, *plVar4 == 0)) {
      _Py_Dealloc(plVar4);
      return;
    }
  }
  return;
}

Assistant:

static void
pythonAttributeDecl(void *user_data,
                    const xmlChar * elem,
                    const xmlChar * name,
                    int type,
                    int def,
                    const xmlChar * defaultValue, xmlEnumerationPtr tree)
{
    PyObject *handler;
    PyObject *nameList;
    PyObject *newName;
    xmlEnumerationPtr node;
    PyObject *result;
    int count;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "attributeDecl")) {
        count = 0;
        for (node = tree; node != NULL; node = node->next) {
            count++;
        }
        nameList = PyList_New(count);
        count = 0;
        for (node = tree; node != NULL; node = node->next) {
            newName = PY_IMPORT_STRING((char *) node->name);
            PyList_SetItem(nameList, count, newName);
	    Py_DECREF(newName);
            count++;
        }
        result = PyObject_CallMethod(handler, (char *) "attributeDecl",
                                     (char *) "ssiisO", elem, name, type,
                                     def, defaultValue, nameList);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(nameList);
        Py_XDECREF(result);
    }
}